

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_char,_1U> * __thiscall
ImageT<unsigned_char,_1U>::yflip(ImageT<unsigned_char,_1U> *this)

{
  uint uVar1;
  uint32_t uVar2;
  void *__dest;
  uint uVar3;
  Color *__src;
  Color *__src_00;
  ulong __n;
  int iVar4;
  
  __n = (ulong)(this->super_Image).width;
  __dest = operator_new__(__n);
  uVar1 = (this->super_Image).height;
  uVar3 = uVar1 - 1;
  if (uVar1 >> 1 <= uVar3) {
    iVar4 = 0;
    do {
      uVar2 = (this->super_Image).width;
      __src_00 = this->pixels + uVar2 * uVar3;
      __src = this->pixels + uVar2 * iVar4;
      memcpy(__dest,__src,__n);
      memcpy(__src,__src_00,__n);
      memcpy(__src_00,__dest,__n);
      iVar4 = iVar4 + 1;
      uVar3 = uVar3 - 1;
    } while ((this->super_Image).height >> 1 <= uVar3);
  }
  operator_delete__(__dest);
  return this;
}

Assistant:

virtual ImageT& yflip() override {
        uint32_t rowSize = width * sizeof(Color);
        // Minimize memory use by only buffering a single row.
        Color* rowBuffer = new Color[width];

        for (uint32_t sy = height-1, dy = 0; sy >= height / 2; sy--, dy++) {
            Color* srcRow = &pixels[width * sy];
            Color* dstRow = &pixels[width * dy];

            memcpy(rowBuffer, dstRow, rowSize);
            memcpy(dstRow, srcRow, rowSize);
            memcpy(srcRow, rowBuffer, rowSize);
        }
        delete[] rowBuffer;
        return *this;
    }